

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_null.h
# Opt level: O0

double __thiscall labeling_NULL::Alloc(labeling_NULL *this)

{
  double dVar1;
  double dVar2;
  double ma_t;
  double t;
  Size local_78;
  Mat_<int> local_70;
  labeling_NULL *local_10;
  labeling_NULL *this_local;
  
  local_10 = this;
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  cv::MatSize::operator()((MatSize *)&local_78);
  cv::Mat_<int>::Mat_(&local_70,&local_78);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar1 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar2 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  return dVar1 - dVar2;
}

Assistant:

double Alloc()
    {
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ma_t;
    }